

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O2

void node::ApplyArgsManOptions(ArgsManager *args,Options *options)

{
  bool bVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  optional<long> oVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  blockmintxfee;
  allocator<char> local_61;
  string local_60;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"-blockmaxweight",(allocator<char> *)&local_60);
  sVar2 = ArgsManager::GetIntArg(args,(string *)&local_40,options->nBlockMaxWeight);
  options->nBlockMaxWeight = sVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"-blockmintxfee",&local_61)
  ;
  ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_40,args,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (local_40._M_engaged == true) {
    oVar3 = ParseMoney((string *)&local_40);
    if (((undefined1  [16])
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (options->blockMinFeeRate).nSatoshisPerK =
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"-printpriority",(allocator<char> *)&local_60);
  bVar1 = ArgsManager::GetBoolArg(args,(string *)&local_40,options->print_modified_fee);
  options->print_modified_fee = bVar1;
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ApplyArgsManOptions(const ArgsManager& args, BlockAssembler::Options& options)
{
    // Block resource limits
    options.nBlockMaxWeight = args.GetIntArg("-blockmaxweight", options.nBlockMaxWeight);
    if (const auto blockmintxfee{args.GetArg("-blockmintxfee")}) {
        if (const auto parsed{ParseMoney(*blockmintxfee)}) options.blockMinFeeRate = CFeeRate{*parsed};
    }
    options.print_modified_fee = args.GetBoolArg("-printpriority", options.print_modified_fee);
}